

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::FileDescriptorSet::IsInitialized(FileDescriptorSet *this)

{
  bool bVar1;
  FileDescriptorSet *in_RDI;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_stack_ffffffffffffffe8;
  
  file(in_RDI);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>>
                    (in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

bool FileDescriptorSet::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->file())) return false;
  return true;
}